

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonReturnFromBlob(JsonParse *pParse,u32 i,sqlite3_context *pCtx,int textOnly)

{
  u8 uVar1;
  sqlite3 *db;
  u8 *puVar2;
  u32 uVar3;
  int iVar4;
  u32 uVar5;
  ulong uVar6;
  char *pcVar7;
  byte bVar8;
  uint uVar9;
  code *xDel;
  uint uVar10;
  uint uVar11;
  i64 iVal;
  uint uVar12;
  u8 *z;
  int iStack_130;
  uint local_11c;
  sqlite3_context *local_118;
  int local_10c;
  double r;
  sqlite3_int64 iRes;
  char *local_f8;
  u64 local_f0;
  u64 local_e8;
  undefined2 local_e0;
  char local_de [102];
  JsonParse local_78;
  
  db = pCtx->pOut->db;
  uVar3 = jsonbPayloadSize(pParse,i,&local_11c);
  if (uVar3 == 0) goto switchD_001965a5_default;
  puVar2 = pParse->aBlob;
  local_118 = pCtx;
  uVar12 = local_11c;
  switch(puVar2[i] & 0xf) {
  case 0:
    if (local_11c == 0) {
      sqlite3_result_null(pCtx);
      return;
    }
    break;
  case 1:
    if (local_11c == 0) {
      iVar4 = 1;
LAB_0019699b:
      sqlite3_result_int(pCtx,iVar4);
      return;
    }
    break;
  case 2:
    if (local_11c == 0) {
      iVar4 = 0;
      goto LAB_0019699b;
    }
    break;
  case 3:
  case 4:
    iRes = 0;
    if (local_11c == 0) break;
    uVar6 = (ulong)(uVar3 + i);
    uVar1 = puVar2[uVar6];
    if (uVar1 == '-') {
      if (local_11c == 1) break;
      uVar6 = (ulong)(uVar3 + i + 1);
      uVar3 = uVar3 + 1;
      uVar12 = local_11c - 1;
    }
    pcVar7 = sqlite3DbStrNDup(db,(char *)(puVar2 + uVar6),(long)(int)uVar12);
    if (pcVar7 == (char *)0x0) goto LAB_00196950;
    local_10c = sqlite3DecOrHexToI64(pcVar7,&iRes);
    sqlite3DbFreeNN(db,pcVar7);
    if (local_10c == 0) {
      iVal = -iRes;
      if (uVar1 != '-') {
        iVal = iRes;
      }
LAB_001969ca:
      sqlite3_result_int64(local_118,iVal);
      return;
    }
    if ((uVar1 == '-') && (local_10c == 3)) {
      iVal = -0x8000000000000000;
      goto LAB_001969ca;
    }
    if ((uVar1 == '-') && (local_10c != 1)) {
      uVar3 = uVar3 - 1;
      uVar12 = uVar12 + 1;
    }
    else {
      pCtx = local_118;
      if (local_10c == 1) break;
    }
    goto LAB_0019660a;
  case 5:
  case 6:
    if (local_11c == 0) break;
LAB_0019660a:
    pcVar7 = sqlite3DbStrNDup(db,(char *)(pParse->aBlob + (uVar3 + i)),(long)(int)uVar12);
    if (pcVar7 == (char *)0x0) {
LAB_00196950:
      sqlite3_result_error_nomem(local_118);
      return;
    }
    iVar4 = sqlite3Strlen30(pcVar7);
    iVar4 = sqlite3AtoF(pcVar7,&r,iVar4,'\x01');
    sqlite3DbFreeNN(db,pcVar7);
    pCtx = local_118;
    if (0 < iVar4) {
      sqlite3_result_double(local_118,r);
      return;
    }
    break;
  case 7:
  case 10:
    z = puVar2 + (uVar3 + i);
    xDel = (_func_void_void_ptr *)0xffffffffffffffff;
LAB_0019686a:
    sqlite3_result_text(local_118,(char *)z,uVar12,xDel);
    return;
  case 8:
  case 9:
    z = (u8 *)sqlite3DbMallocRaw(db,(ulong)(local_11c + 1));
    if (z != (u8 *)0x0) {
      uVar12 = 0;
      uVar11 = 0;
      while( true ) {
        if (local_11c < uVar11 || local_11c - uVar11 == 0) break;
        if (puVar2[(ulong)uVar11 + (ulong)(uVar3 + i)] == '\\') {
          uVar5 = jsonUnescapeOneChar((char *)(puVar2 + (ulong)uVar11 + (ulong)(uVar3 + i)),
                                      local_11c - uVar11,(u32 *)&iRes);
          if ((uint)iRes < 0x80) {
            iStack_130 = 1;
            uVar10 = uVar12;
            uVar9 = (uint)iRes;
LAB_0019683f:
            uVar12 = uVar12 + iStack_130;
            z[uVar10] = (u8)uVar9;
          }
          else {
            bVar8 = (byte)iRes;
            if ((uint)iRes < 0x800) {
              uVar10 = uVar12 + 1;
              z[uVar12] = (byte)((uint)iRes >> 6) | 0xc0;
              uVar9 = (uint)(bVar8 & 0x3f | 0x80);
              iStack_130 = 2;
              goto LAB_0019683f;
            }
            if ((uint)iRes < 0x10000) {
              z[uVar12] = (byte)((uint)iRes >> 0xc) | 0xe0;
              uVar10 = uVar12 + 2;
              z[uVar12 + 1] = (byte)((uint)iRes >> 6) & 0x3f | 0x80;
              uVar9 = (uint)(bVar8 & 0x3f | 0x80);
              iStack_130 = 3;
              goto LAB_0019683f;
            }
            if ((uint)iRes != 0x99999) {
              z[uVar12] = (byte)((uint)iRes >> 0x12) | 0xf0;
              z[uVar12 + 1] = (byte)((uint)iRes >> 0xc) & 0x3f | 0x80;
              uVar10 = uVar12 + 3;
              z[uVar12 + 2] = (byte)((uint)iRes >> 6) & 0x3f | 0x80;
              uVar9 = (uint)(bVar8 & 0x3f | 0x80);
              iStack_130 = 4;
              goto LAB_0019683f;
            }
          }
          uVar11 = (uVar11 + uVar5) - 1;
        }
        else {
          z[uVar12] = puVar2[(ulong)uVar11 + (ulong)(uVar3 + i)];
          uVar12 = uVar12 + 1;
        }
        uVar11 = uVar11 + 1;
      }
      z[uVar12] = '\0';
      xDel = sqlite3OomClear;
      goto LAB_0019686a;
    }
    goto LAB_00196950;
  case 0xb:
  case 0xc:
    local_78.aBlob = puVar2 + i;
    if ((textOnly == 0) && (((ulong)pCtx->pFunc->pUserData & 8) != 0)) {
      sqlite3_result_blob(pCtx,local_78.aBlob,local_11c + uVar3,
                          (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
    local_78.zJson = (char *)0x0;
    local_78.db = (sqlite3 *)0x0;
    local_78.nJson = 0;
    local_78.nJPRef = 0;
    local_78.iErr = 0;
    local_78.iDepth = 0;
    local_78.nErr = '\0';
    local_78.oom = '\0';
    local_78.bJsonIsRCStr = '\0';
    local_78.hasNonstd = '\0';
    local_78.bReadOnly = '\0';
    local_78.eEdit = '\0';
    local_78.delta = 0;
    local_78.nIns = 0;
    local_78.iLabel = 0;
    local_78.aIns = (u8 *)0x0;
    local_78.nBlobAlloc = 0;
    local_78.nBlob = local_11c + uVar3;
    local_f8 = local_de;
    local_f0 = 100;
    local_e8 = 0;
    local_e0._0_1_ = '\x01';
    local_e0._1_1_ = '\0';
    iRes = (sqlite3_int64)pCtx;
    jsonTranslateBlobToText(&local_78,0,(JsonString *)&iRes);
    jsonReturnString((JsonString *)&iRes,(JsonParse *)0x0,(sqlite3_context *)0x0);
    return;
  }
switchD_001965a5_default:
  sqlite3_result_error(pCtx,"malformed JSON",-1);
  return;
}

Assistant:

static void jsonReturnFromBlob(
  JsonParse *pParse,          /* Complete JSON parse tree */
  u32 i,                      /* Index of the node */
  sqlite3_context *pCtx,      /* Return value for this function */
  int textOnly                /* return text JSON.  Disregard user-data */
){
  u32 n, sz;
  int rc;
  sqlite3 *db = sqlite3_context_db_handle(pCtx);

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    sqlite3_result_error(pCtx, "malformed JSON", -1);
    return;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_null(pCtx);
      break;
    }
    case JSONB_TRUE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSONB_FALSE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSONB_INT5:
    case JSONB_INT: {
      sqlite3_int64 iRes = 0;
      char *z;
      int bNeg = 0;
      char x;
      if( sz==0 ) goto returnfromblob_malformed;
      x = (char)pParse->aBlob[i+n];
      if( x=='-' ){
        if( sz<2 ) goto returnfromblob_malformed;
        n++;
        sz--;
        bNeg = 1;
      }
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3DecOrHexToI64(z, &iRes);
      sqlite3DbFree(db, z);
      if( rc==0 ){
        sqlite3_result_int64(pCtx, bNeg ? -iRes : iRes);
      }else if( rc==3 && bNeg ){
        sqlite3_result_int64(pCtx, SMALLEST_INT64);
      }else if( rc==1 ){
        goto returnfromblob_malformed;
      }else{
        if( bNeg ){ n--; sz++; }
        goto to_double;
      }
      break;
    }
    case JSONB_FLOAT5:
    case JSONB_FLOAT: {
      double r;
      char *z;
      if( sz==0 ) goto returnfromblob_malformed;
    to_double:
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
      sqlite3DbFree(db, z);
      if( rc<=0 ) goto returnfromblob_malformed;
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSONB_TEXTRAW:
    case JSONB_TEXT: {
      sqlite3_result_text(pCtx, (char*)&pParse->aBlob[i+n], sz,
                          SQLITE_TRANSIENT);
      break;
    }
    case JSONB_TEXT5:
    case JSONB_TEXTJ: {
      /* Translate JSON formatted string into raw text */
      u32 iIn, iOut;
      const char *z;
      char *zOut;
      u32 nOut = sz;
      z = (const char*)&pParse->aBlob[i+n];
      zOut = sqlite3DbMallocRaw(db, nOut+1);
      if( zOut==0 ) goto returnfromblob_oom;
      for(iIn=iOut=0; iIn<sz; iIn++){
        char c = z[iIn];
        if( c=='\\' ){
          u32 v;
          u32 szEscape = jsonUnescapeOneChar(&z[iIn], sz-iIn, &v);
          if( v<=0x7f ){
            zOut[iOut++] = (char)v;
          }else if( v<=0x7ff ){
            assert( szEscape>=2 );
            zOut[iOut++] = (char)(0xc0 | (v>>6));
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v<0x10000 ){
            assert( szEscape>=3 );
            zOut[iOut++] = 0xe0 | (v>>12);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v==JSON_INVALID_CHAR ){
            /* Silently ignore illegal unicode */
          }else{
            assert( szEscape>=4 );
            zOut[iOut++] = 0xf0 | (v>>18);
            zOut[iOut++] = 0x80 | ((v>>12)&0x3f);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }
          iIn += szEscape - 1;
        }else{
          zOut[iOut++] = c;
        }
      } /* end for() */
      assert( iOut<=nOut );
      zOut[iOut] = 0;
      sqlite3_result_text(pCtx, zOut, iOut, SQLITE_DYNAMIC);
      break;
    }
    case JSONB_ARRAY:
    case JSONB_OBJECT: {
      int flags = textOnly ? 0 : SQLITE_PTR_TO_INT(sqlite3_user_data(pCtx));
      if( flags & JSON_BLOB ){
        sqlite3_result_blob(pCtx, &pParse->aBlob[i], sz+n, SQLITE_TRANSIENT);
      }else{
        jsonReturnTextJsonFromBlob(pCtx, &pParse->aBlob[i], sz+n);
      }
      break;
    }
    default: {
      goto returnfromblob_malformed;
    }
  }
  return;

returnfromblob_oom:
  sqlite3_result_error_nomem(pCtx);
  return;

returnfromblob_malformed:
  sqlite3_result_error(pCtx, "malformed JSON", -1);
  return;
}